

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  ulong *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  __m128i *palVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int32_t segNum;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  longlong lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar39;
  undefined1 auVar38 [16];
  undefined4 uVar40;
  undefined4 uVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i_64_t B;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int64_t iVar48;
  undefined1 auVar49 [16];
  ulong uVar51;
  undefined1 auVar50 [16];
  __m128i_64_t B_2;
  ulong uVar52;
  ulong uVar53;
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  __m128i_64_t B_1;
  ulong uVar58;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_120;
  ulong local_110;
  int local_108;
  long local_f8;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar27 = (ulong)(uint)s2Len;
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_64_cold_1();
        }
        else {
          iVar12 = uVar4 - 1;
          uVar1 = (ulong)uVar4 + 1;
          uVar24 = uVar1 >> 1;
          uVar23 = (uint)uVar24;
          iVar13 = iVar12 / (int)uVar23;
          iVar17 = -open;
          iVar19 = ppVar6->min;
          uVar33 = 0x8000000000000000 - (long)iVar19;
          if (iVar19 != iVar17 && SBORROW4(iVar19,iVar17) == iVar19 + open < 0) {
            uVar33 = (ulong)(uint)open | 0x8000000000000000;
          }
          iVar19 = ppVar6->max;
          ppVar15 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar15->flag | 0x2820402;
            ptr = parasail_memalign___m128i(0x10,uVar24);
            ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar24);
            ptr_02 = parasail_memalign___m128i(0x10,uVar24);
            ptr_03 = parasail_memalign___m128i(0x10,uVar24);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar14 = s2Len + -1;
              iVar18 = 1 - iVar13;
              uVar34 = (ulong)(uint)open;
              uVar37 = (ulong)(uint)gap;
              local_110 = uVar33 + 1;
              lVar16 = 0x7ffffffffffffffe - (long)iVar19;
              uVar40 = (undefined4)local_110;
              uVar42 = (undefined4)(local_110 >> 0x20);
              auVar45._8_4_ = (int)lVar16;
              auVar45._0_8_ = lVar16;
              auVar45._12_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar43._0_8_ = (long)iVar18;
              auVar43._8_4_ = iVar18;
              auVar43._12_4_ = iVar18 >> 0x1f;
              lVar21 = (long)iVar17;
              uVar28 = 0;
              do {
                lVar30 = 0;
                lVar29 = lVar21;
                do {
                  lVar20 = lVar29;
                  if (s1_beg != 0) {
                    lVar20 = 0;
                  }
                  local_58[lVar30 + 2] = lVar20;
                  local_58[lVar30] = lVar20 - (ulong)(uint)open;
                  lVar30 = lVar30 + 1;
                  lVar29 = lVar29 - uVar24 * (uint)gap;
                } while (lVar30 == 1);
                ptr_02[uVar28][0] = local_58[2];
                ptr_02[uVar28][1] = local_58[3];
                ptr[uVar28][0] = local_58[0];
                ptr[uVar28][1] = local_58[1];
                uVar28 = uVar28 + 1;
                lVar21 = lVar21 - (ulong)(uint)gap;
              } while (uVar28 != uVar24);
              *ptr_00 = 0;
              uVar28 = 1;
              do {
                iVar19 = 0;
                if (s2_beg == 0) {
                  iVar19 = iVar17;
                }
                ptr_00[uVar28] = (long)iVar19;
                uVar28 = uVar28 + 1;
                iVar17 = iVar17 - gap;
              } while (s2Len + 1 != uVar28);
              lVar21 = -uVar34;
              uVar36 = (ulong)(uint)open;
              lVar29 = -uVar36;
              palVar22 = ptr_03 + (uVar23 - 1);
              uVar28 = uVar24;
              do {
                (*palVar22)[0] = lVar21;
                (*palVar22)[1] = lVar29;
                lVar21 = lVar21 - uVar37;
                uVar39 = (ulong)(uint)gap;
                lVar29 = lVar29 - uVar39;
                lVar30 = lVar21;
                if (auVar45._0_8_ < lVar21) {
                  lVar30 = auVar45._0_8_;
                }
                lVar20 = lVar29;
                if (auVar45._8_8_ < lVar29) {
                  lVar20 = auVar45._8_8_;
                }
                auVar45._8_8_ = lVar20;
                auVar45._0_8_ = lVar30;
                palVar22 = palVar22 + -1;
                iVar19 = (int)uVar28;
                uVar25 = iVar19 - 1;
                uVar28 = (ulong)uVar25;
              } while (uVar25 != 0 && 0 < iVar19);
              palVar22 = ptr_02 + (uVar23 - 1);
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = uVar27;
              }
              lVar21 = (ulong)(uVar23 + (uVar23 == 0)) << 4;
              local_f8 = 0;
              auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 1);
              auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
              auVar46._8_4_ = uVar40;
              auVar46._0_8_ = local_110;
              auVar46._12_4_ = uVar42;
              auVar47._8_4_ = uVar40;
              auVar47._0_8_ = local_110;
              auVar47._12_4_ = uVar42;
              uVar26 = 0;
              local_120 = iVar14;
              do {
                auVar49._8_4_ = (int)(*palVar22)[0];
                auVar49._0_8_ = (*palVar22)[0];
                auVar49._12_4_ = *(undefined4 *)((long)*palVar22 + 4);
                iVar19 = ppVar6->mapper[(byte)s2[uVar26]];
                auVar8._8_4_ = uVar40;
                auVar8._0_8_ = local_110;
                auVar8._12_4_ = uVar42;
                uVar52 = local_110 - (*ptr_03)[0];
                uVar53 = auVar8._8_8_ - (*ptr_03)[1];
                lVar30 = 0;
                auVar54._8_4_ = uVar40;
                auVar54._0_8_ = local_110;
                auVar54._12_4_ = uVar42;
                iVar48 = ptr_00[uVar26];
                lVar29 = auVar49._8_8_;
                do {
                  plVar2 = (long *)((long)*ptr_02 + lVar30);
                  lVar20 = *plVar2;
                  lVar10 = plVar2[1];
                  plVar2 = (long *)((long)*ptr + lVar30);
                  uVar55 = *plVar2 - uVar37;
                  uVar56 = plVar2[1] - uVar39;
                  uVar57 = lVar20 - uVar34;
                  uVar58 = lVar10 - uVar36;
                  if ((long)uVar57 < (long)uVar55) {
                    uVar57 = uVar55;
                  }
                  if ((long)uVar58 < (long)uVar56) {
                    uVar58 = uVar56;
                  }
                  plVar2 = (long *)((long)pvVar5 + lVar30 + (long)iVar19 * (long)(int)uVar23 * 0x10)
                  ;
                  uVar56 = iVar48 + *plVar2;
                  uVar51 = lVar29 + plVar2[1];
                  plVar2 = (long *)((long)*ptr_03 + lVar30);
                  uVar55 = uVar52 + *plVar2;
                  lVar29 = uVar53 + plVar2[1];
                  if ((long)uVar55 < (long)auVar54._0_8_) {
                    uVar55 = auVar54._0_8_;
                  }
                  if (lVar29 < auVar54._8_8_) {
                    lVar29 = auVar54._8_8_;
                  }
                  uVar52 = uVar57;
                  if ((long)uVar57 <= (long)uVar56) {
                    uVar52 = uVar56;
                  }
                  uVar53 = uVar58;
                  if ((long)uVar58 <= (long)uVar51) {
                    uVar53 = uVar51;
                  }
                  auVar54._8_8_ = lVar29;
                  auVar54._0_8_ = uVar55;
                  puVar3 = (ulong *)((long)*ptr + lVar30);
                  *puVar3 = uVar57;
                  puVar3[1] = uVar58;
                  puVar3 = (ulong *)((long)*ptr_01 + lVar30);
                  *puVar3 = uVar52;
                  puVar3[1] = uVar53;
                  lVar30 = lVar30 + 0x10;
                  iVar48 = lVar20;
                  lVar29 = lVar10;
                } while (lVar21 != lVar30);
                uVar53 = uVar26 + 1;
                uVar57 = ptr_00[uVar26 + 1];
                uVar58 = (*ptr_03)[0] + uVar57;
                if ((long)uVar58 < (long)uVar55) {
                  uVar58 = uVar55;
                }
                uVar55 = local_110;
                if ((long)local_110 < (long)uVar57) {
                  uVar55 = uVar57;
                }
                uVar57 = uVar58;
                if ((long)uVar58 < (long)uVar52) {
                  uVar57 = uVar52;
                }
                lVar30 = 0;
                lVar29 = local_f8;
                uVar52 = local_110;
                do {
                  uVar56 = uVar52 - uVar37;
                  uVar51 = uVar58 - uVar39;
                  uVar52 = uVar55 - uVar34;
                  if ((long)(uVar55 - uVar34) < (long)uVar56) {
                    uVar52 = uVar56;
                  }
                  uVar58 = uVar57 - uVar36;
                  if ((long)(uVar57 - uVar36) < (long)uVar51) {
                    uVar58 = uVar51;
                  }
                  uVar55 = *(ulong *)((long)*ptr_01 + lVar30);
                  uVar57 = *(ulong *)((long)*ptr_01 + lVar30 + 8);
                  if ((long)uVar55 <= (long)uVar52) {
                    uVar55 = uVar52;
                  }
                  if ((long)uVar57 <= (long)uVar58) {
                    uVar57 = uVar58;
                  }
                  uVar56 = auVar45._0_8_;
                  if ((long)uVar55 <= (long)auVar45._0_8_) {
                    uVar56 = uVar55;
                  }
                  uVar51 = auVar45._8_8_;
                  if ((long)uVar57 <= (long)auVar45._8_8_) {
                    uVar51 = uVar57;
                  }
                  if ((long)uVar52 <= (long)uVar56) {
                    uVar56 = uVar52;
                  }
                  if ((long)uVar58 <= (long)uVar51) {
                    uVar51 = uVar58;
                  }
                  puVar3 = (ulong *)((long)*ptr_02 + lVar30);
                  *puVar3 = uVar55;
                  puVar3[1] = uVar57;
                  uVar31 = auVar47._0_8_;
                  if ((long)auVar47._0_8_ <= (long)uVar55) {
                    uVar31 = uVar55;
                  }
                  uVar32 = auVar47._8_8_;
                  if ((long)auVar47._8_8_ <= (long)uVar57) {
                    uVar32 = uVar57;
                  }
                  auVar45._8_8_ = uVar51;
                  auVar45._0_8_ = uVar56;
                  auVar47._8_8_ = uVar32;
                  auVar47._0_8_ = uVar31;
                  piVar7 = ((ppVar15->field_4).rowcols)->score_row;
                  *(int *)((long)piVar7 + lVar29) = (int)uVar55;
                  *(int *)((long)piVar7 + uVar24 * uVar27 * 4 + lVar29) = (int)uVar57;
                  lVar30 = lVar30 + 0x10;
                  lVar29 = lVar29 + uVar27 * 4;
                } while (lVar21 != lVar30);
                lVar30 = auVar46._0_8_;
                lVar29 = ptr_02[(uint)(iVar12 % (int)uVar23)][0];
                uVar52 = ptr_02[(uint)(iVar12 % (int)uVar23)][1];
                uVar58 = auVar46._8_8_;
                uVar57 = uVar58;
                if ((long)uVar58 < (long)uVar52) {
                  uVar57 = uVar52;
                }
                lVar20 = lVar30;
                if (lVar30 < lVar29) {
                  lVar20 = lVar29;
                }
                auVar50._8_8_ = -(ulong)((long)uVar58 < (long)uVar52);
                auVar50._0_8_ = -(ulong)(lVar30 < lVar29);
                auVar50 = auVar50 & auVar44;
                local_108 = (int)uVar26;
                if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar50 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar50[0xf] < '\0') {
                  local_120 = local_108;
                }
                auVar46._8_8_ = uVar57;
                auVar46._0_8_ = lVar20;
                local_f8 = local_f8 + 4;
                uVar26 = uVar53;
              } while (uVar53 != uVar28);
              if ((s2_end != 0) && (local_110 = uVar57, iVar13 < 1)) {
                do {
                  local_110 = auVar46._0_8_;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = local_110;
                  auVar46 = auVar9 << 0x40;
                } while (iVar13 < 0);
              }
              iVar19 = iVar12;
              if ((s1_end != 0) && ((uVar1 & 0x7ffffffe) != 0)) {
                uVar27 = 0;
                do {
                  uVar25 = 0;
                  if ((uVar27 & 1) != 0) {
                    uVar25 = uVar23;
                  }
                  iVar17 = uVar25 + ((uint)(uVar27 >> 1) & 0x7fffffff);
                  iVar18 = iVar19;
                  iVar11 = local_120;
                  uVar1 = local_110;
                  if ((iVar17 < (int)uVar4) &&
                     (uVar24 = (*ptr_02)[uVar27], iVar18 = iVar17, iVar11 = iVar14, uVar1 = uVar24,
                     (long)uVar24 <= (long)local_110)) {
                    if (iVar19 <= iVar17) {
                      iVar17 = iVar19;
                    }
                    if (local_120 != iVar14) {
                      iVar17 = iVar19;
                    }
                    iVar18 = iVar19;
                    iVar11 = local_120;
                    uVar1 = local_110;
                    if (uVar24 == local_110) {
                      iVar18 = iVar17;
                    }
                  }
                  local_110 = uVar1;
                  local_120 = iVar11;
                  iVar19 = iVar18;
                  uVar27 = uVar27 + 1;
                } while ((uVar23 & 0x3fffffff) * 2 != (int)uVar27);
              }
              if (s2_end == 0 && s1_end == 0) {
                lVar35 = ptr_02[(uint)(iVar12 % (int)uVar23)][0];
                local_110._0_4_ = (int)ptr_02[(uint)(iVar12 % (int)uVar23)][1];
                iVar19 = iVar12;
                local_120 = iVar14;
                if (iVar13 < 1) {
                  do {
                    local_110._0_4_ = (int)lVar35;
                    lVar35 = 0;
                  } while (iVar13 < 0);
                }
              }
              auVar38._8_8_ = -(ulong)((long)uVar51 <= (long)uVar33);
              auVar38._0_8_ = -(ulong)((long)uVar56 <= (long)uVar33);
              auVar41._8_8_ = -(ulong)(lVar16 < (long)uVar32);
              auVar41._0_8_ = -(ulong)(lVar16 < (long)uVar31);
              auVar41 = auVar41 | auVar38;
              if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                local_110._0_4_ = 0;
                local_120 = 0;
                iVar19 = 0;
              }
              ppVar15->score = (int)local_110;
              ppVar15->end_query = iVar19;
              ppVar15->end_ref = local_120;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar15;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}